

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O1

Aig_Man_t * Saig_SynchSequenceApply(Aig_Man_t *pAig,int nWords,int fVerbose)

{
  int iVar1;
  Vec_Str_t *vSequence;
  void **__ptr;
  Vec_Ptr_t *vSimInfo;
  Aig_Man_t *pAVar2;
  long lVar3;
  long lVar4;
  int level;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vSequence = Saig_SynchSequence(pAig,nWords);
  if (vSequence == (Vec_Str_t *)0x0) {
    iVar1 = 0x974727;
    printf("Design 1: Synchronizing sequence is not found. ");
LAB_0066a515:
    if (fVerbose != 0) {
      Abc_Print(iVar1,"%s =","Time");
      level = 3;
      iVar1 = clock_gettime(3,&local_40);
      if (iVar1 < 0) {
        lVar4 = -1;
      }
      else {
        lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
      goto LAB_0066a59d;
    }
  }
  else if (fVerbose != 0) {
    iVar1 = 0x974757;
    printf("Design 1: Synchronizing sequence of length %4d is found. ",
           (long)vSequence->nSize / (long)pAig->nTruePis & 0xffffffff,
           (long)vSequence->nSize % (long)pAig->nTruePis & 0xffffffff);
    goto LAB_0066a515;
  }
  putchar(10);
LAB_0066a59d:
  if (vSequence == (Vec_Str_t *)0x0) {
    puts("Quitting synchronization.");
    pAVar2 = (Aig_Man_t *)0x0;
  }
  else {
    iVar1 = pAig->vObjs->nSize;
    lVar3 = (long)iVar1;
    __ptr = (void **)malloc(lVar3 * 0xc);
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        *(long *)((long)__ptr + lVar4 * 2) = (long)__ptr + lVar4 + lVar3 * 8;
        lVar4 = lVar4 + 4;
      } while (lVar3 * 4 - lVar4 != 0);
    }
    vSimInfo = (Vec_Ptr_t *)malloc(0x10);
    vSimInfo->nSize = iVar1;
    vSimInfo->nCap = iVar1;
    vSimInfo->pArray = __ptr;
    iVar1 = Saig_SynchSequenceRun(pAig,vSimInfo,vSequence,1);
    if (iVar1 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x214,"Aig_Man_t *Saig_SynchSequenceApply(Aig_Man_t *, int, int)");
    }
    pAVar2 = Saig_ManDupInitZero(pAig);
    if (__ptr != (void **)0x0) {
      free(__ptr);
      vSimInfo->pArray = (void **)0x0;
    }
    free(vSimInfo);
    if (vSequence->pArray != (char *)0x0) {
      free(vSequence->pArray);
      vSequence->pArray = (char *)0x0;
    }
    free(vSequence);
    Aig_ManCleanMarkA(pAig);
  }
  return pAVar2;
}

Assistant:

Aig_Man_t * Saig_SynchSequenceApply( Aig_Man_t * pAig, int nWords, int fVerbose )
{
    Aig_Man_t * pAigZero;
    Vec_Str_t * vSequence;
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clk;

clk = Abc_Clock();
    // derive synchronization sequence
    vSequence = Saig_SynchSequence( pAig, nWords );
    if ( vSequence == NULL )
        printf( "Design 1: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 1: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSequence) / Saig_ManPiNum(pAig) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );
    if ( vSequence == NULL )
    {
        printf( "Quitting synchronization.\n" );
        return NULL;
    }

    // apply synchronization sequence
    vSimInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), 1 );
    RetValue = Saig_SynchSequenceRun( pAig, vSimInfo, vSequence, 1 );
    assert( RetValue == 0 );
    // duplicate 
    pAigZero = Saig_ManDupInitZero( pAig );
    // cleanup
    Vec_PtrFree( vSimInfo );
    Vec_StrFree( vSequence );
    Aig_ManCleanMarkA( pAig );
    return pAigZero;
}